

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

ModulePtr __thiscall
chaiscript::bootstrap::standard_library::
random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (standard_library *this,string *param_1,ModulePtr *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModulePtr MVar3;
  allocator local_7a [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_78;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string&(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,int),chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,int)_1_>,chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,int)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_68);
  std::__cxx11::string::string((string *)&local_38,"[]",local_7a);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_68,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string_const&(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int),chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)_1_>,chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_78);
  std::__cxx11::string::string((string *)&local_58,"[]",local_7a);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr random_access_container_type(const std::string &/*type*/, ModulePtr m = std::make_shared<Module>())
        {
          //In the interest of runtime safety for the m, we prefer the at() method for [] access,
          //to throw an exception in an out of bounds condition.
          m->add(
              fun(
                [](ContainerType &c, int index) -> typename ContainerType::reference {
                  return c.at(index);
                }), "[]");

          m->add(
              fun(
                [](const ContainerType &c, int index) -> typename ContainerType::const_reference {
                  return c.at(index);
                }), "[]");

          return m;
        }